

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_free_page_element(nk_context *ctx,nk_page_element *elem)

{
  void *buffer_end;
  void *elem_end;
  nk_page_element *elem_local;
  nk_context *ctx_local;
  
  if (ctx->use_pool == 0) {
    if (elem + 1 == (nk_page_element *)((long)(ctx->memory).memory.ptr + (ctx->memory).size)) {
      (ctx->memory).size = (ctx->memory).size - 0x200;
    }
    else {
      nk_link_page_element_into_freelist(ctx,elem);
    }
  }
  else {
    nk_link_page_element_into_freelist(ctx,elem);
  }
  return;
}

Assistant:

NK_LIB void
nk_free_page_element(struct nk_context *ctx, struct nk_page_element *elem)
{
    /* we have a pool so just add to free list */
    if (ctx->use_pool) {
        nk_link_page_element_into_freelist(ctx, elem);
        return;
    }
    /* if possible remove last element from back of fixed memory buffer */
    {void *elem_end = (void*)(elem + 1);
    void *buffer_end = (nk_byte*)ctx->memory.memory.ptr + ctx->memory.size;
    if (elem_end == buffer_end)
        ctx->memory.size -= sizeof(struct nk_page_element);
    else nk_link_page_element_into_freelist(ctx, elem);}
}